

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::GenerateFastInlineBuiltInMathRandom(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  IRType type;
  uint uVar4;
  int iVar5;
  DWORD DVar6;
  Opnd *this_00;
  undefined4 *puVar7;
  Instr *dst_00;
  ScriptContextInfo *pSVar8;
  RegOpnd *dst_01;
  RegOpnd *dst_02;
  RegOpnd *dst_03;
  RegOpnd *dst_04;
  undefined4 extraout_var;
  MemRefOpnd *pMVar9;
  undefined4 extraout_var_00;
  IntConstOpnd *pIVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ThreadContextInfo *this_01;
  intptr_t pMemLoc;
  Instr *instr_00;
  Instr *helperCallInstr;
  Opnd *tmpdst;
  RegOpnd *r4;
  RegOpnd *r3;
  RegOpnd *r1;
  RegOpnd *r0;
  uint64 mMant;
  uint64 mExp;
  Opnd *dst;
  Instr *retInstr;
  Instr *instr_local;
  Lowerer *this_local;
  
  this_00 = IR::Instr::GetDst(instr);
  bVar3 = IR::Opnd::IsFloat(this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2f99,"(instr->GetDst()->IsFloat())","dst must be float.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pIVar1 = instr->m_prev;
  dst_00 = (Instr *)IR::Instr::GetDst(instr);
  pSVar8 = Func::GetScriptContextInfo(this->m_func);
  uVar4 = (*pSVar8->_vptr_ScriptContextInfo[0x1e])();
  if ((uVar4 & 1) == 0) {
    bVar3 = IR::Opnd::IsRegOpnd((Opnd *)dst_00);
    helperCallInstr = dst_00;
    if (!bVar3) {
      type = IR::Opnd::GetType((Opnd *)dst_00);
      helperCallInstr = (Instr *)IR::RegOpnd::New(type,instr->m_func);
    }
    LoadScriptContext(this,instr);
    instr_00 = IR::Instr::New(CALL,(Opnd *)helperCallInstr,instr->m_func);
    IR::Instr::InsertBefore(instr,instr_00);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr_00,HelperDirectMath_Random,(LabelInstr *)0x0,(Opnd *)0x0,
               (PropertySymOpnd *)0x0,false);
    if (helperCallInstr != dst_00) {
      InsertMove((Opnd *)dst_00,(Opnd *)helperCallInstr,instr,true);
    }
  }
  else {
    dst_01 = IR::RegOpnd::New(TyUint64,this->m_func);
    dst_02 = IR::RegOpnd::New(TyUint64,this->m_func);
    dst_03 = IR::RegOpnd::New(TyUint64,this->m_func);
    dst_04 = IR::RegOpnd::New(TyFloat64,this->m_func);
    pSVar8 = Func::GetScriptContextInfo(this->m_func);
    iVar5 = (*pSVar8->_vptr_ScriptContextInfo[0x16])();
    DVar6 = Js::JavascriptLibrary::GetRandSeed1Offset();
    pMVar9 = IR::MemRefOpnd::New((void *)(CONCAT44(extraout_var,iVar5) + (ulong)DVar6),TyUint64,
                                 instr->m_func,AddrOpndKindDynamicMisc);
    InsertMove(&dst_01->super_Opnd,&pMVar9->super_Opnd,instr,true);
    pSVar8 = Func::GetScriptContextInfo(this->m_func);
    iVar5 = (*pSVar8->_vptr_ScriptContextInfo[0x16])();
    DVar6 = Js::JavascriptLibrary::GetRandSeed0Offset();
    pMVar9 = IR::MemRefOpnd::New((void *)(CONCAT44(extraout_var_00,iVar5) + (ulong)DVar6),TyUint64,
                                 instr->m_func,AddrOpndKindDynamicMisc);
    InsertMove(&dst_02->super_Opnd,&pMVar9->super_Opnd,instr,true);
    InsertMove(&dst_03->super_Opnd,&dst_02->super_Opnd,instr,true);
    pIVar10 = IR::IntConstOpnd::New(0x17,TyInt8,this->m_func,false);
    InsertShift(Shl_A,false,&dst_03->super_Opnd,&dst_03->super_Opnd,&pIVar10->super_Opnd,instr);
    InsertXor(&dst_02->super_Opnd,&dst_02->super_Opnd,&dst_03->super_Opnd,instr);
    InsertMove(&dst_03->super_Opnd,&dst_02->super_Opnd,instr,true);
    pIVar10 = IR::IntConstOpnd::New(0x11,TyInt8,this->m_func,false);
    InsertShift(ShrU_A,false,&dst_03->super_Opnd,&dst_03->super_Opnd,&pIVar10->super_Opnd,instr);
    InsertXor(&dst_02->super_Opnd,&dst_02->super_Opnd,&dst_03->super_Opnd,instr);
    InsertXor(&dst_02->super_Opnd,&dst_02->super_Opnd,&dst_01->super_Opnd,instr);
    InsertMove(&dst_03->super_Opnd,&dst_01->super_Opnd,instr,true);
    pIVar10 = IR::IntConstOpnd::New(0x1a,TyInt8,this->m_func,false);
    InsertShift(ShrU_A,false,&dst_03->super_Opnd,&dst_03->super_Opnd,&pIVar10->super_Opnd,instr);
    InsertXor(&dst_02->super_Opnd,&dst_02->super_Opnd,&dst_03->super_Opnd,instr);
    pSVar8 = Func::GetScriptContextInfo(this->m_func);
    iVar5 = (*pSVar8->_vptr_ScriptContextInfo[0x16])();
    DVar6 = Js::JavascriptLibrary::GetRandSeed0Offset();
    pMVar9 = IR::MemRefOpnd::New((void *)(CONCAT44(extraout_var_01,iVar5) + (ulong)DVar6),TyUint64,
                                 this->m_func,AddrOpndKindDynamicMisc);
    InsertMove(&pMVar9->super_Opnd,&dst_01->super_Opnd,instr,true);
    pSVar8 = Func::GetScriptContextInfo(this->m_func);
    iVar5 = (*pSVar8->_vptr_ScriptContextInfo[0x16])();
    DVar6 = Js::JavascriptLibrary::GetRandSeed1Offset();
    pMVar9 = IR::MemRefOpnd::New((void *)(CONCAT44(extraout_var_02,iVar5) + (ulong)DVar6),TyUint64,
                                 this->m_func,AddrOpndKindDynamicMisc);
    InsertMove(&pMVar9->super_Opnd,&dst_02->super_Opnd,instr,true);
    InsertAdd(false,&dst_02->super_Opnd,&dst_02->super_Opnd,&dst_01->super_Opnd,instr);
    pIVar10 = IR::IntConstOpnd::New(0xfffffffffffff,TyInt64,this->m_func,true);
    InsertMove(&dst_03->super_Opnd,&pIVar10->super_Opnd,instr,true);
    InsertAnd(&dst_02->super_Opnd,&dst_02->super_Opnd,&dst_03->super_Opnd,instr);
    pIVar10 = IR::IntConstOpnd::New(0x3ff0000000000000,TyInt64,this->m_func,true);
    InsertMove(&dst_03->super_Opnd,&pIVar10->super_Opnd,instr,true);
    InsertOr(&dst_02->super_Opnd,&dst_02->super_Opnd,&dst_03->super_Opnd,instr);
    InsertMoveBitCast((Opnd *)dst_00,&dst_02->super_Opnd,instr);
    this_01 = Func::GetThreadContextInfo(this->m_func);
    pMemLoc = ThreadContextInfo::GetDoubleOnePointZeroAddr(this_01);
    pMVar9 = IR::MemRefOpnd::New(pMemLoc,TyFloat64,this->m_func,AddrOpndKindDynamicDoubleRef);
    InsertMove(&dst_04->super_Opnd,&pMVar9->super_Opnd,instr,true);
    InsertSub(false,(Opnd *)dst_00,(Opnd *)dst_00,&dst_04->super_Opnd,instr);
  }
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr*
Lowerer::GenerateFastInlineBuiltInMathRandom(IR::Instr* instr)
{
    AssertMsg(instr->GetDst()->IsFloat(), "dst must be float.");
    IR::Instr* retInstr = instr->m_prev;
    IR::Opnd* dst = instr->GetDst();

#if defined(_M_X64)
    if (m_func->GetScriptContextInfo()->IsPRNGSeeded())
    {
        const uint64 mExp = 0x3FF0000000000000;
        const uint64 mMant = 0x000FFFFFFFFFFFFF;

        IR::RegOpnd* r0 = IR::RegOpnd::New(TyUint64, m_func);  // s0
        IR::RegOpnd* r1 = IR::RegOpnd::New(TyUint64, m_func);  // s1
        IR::RegOpnd* r3 = IR::RegOpnd::New(TyUint64, m_func);  // helper uint64 reg
        IR::RegOpnd* r4 = IR::RegOpnd::New(TyFloat64, m_func); // helper float64 reg

        // ===========================================================
        // s0 = scriptContext->GetLibrary()->GetRandSeed1();
        // s1 = scriptContext->GetLibrary()->GetRandSeed0();
        // ===========================================================
        this->InsertMove(r0,
            IR::MemRefOpnd::New((BYTE*)m_func->GetScriptContextInfo()->GetLibraryAddr() + Js::JavascriptLibrary::GetRandSeed1Offset(), TyUint64, instr->m_func), instr);
        this->InsertMove(r1,
            IR::MemRefOpnd::New((BYTE*)m_func->GetScriptContextInfo()->GetLibraryAddr() + Js::JavascriptLibrary::GetRandSeed0Offset(), TyUint64, instr->m_func), instr);

        // ===========================================================
        // s1 ^= s1 << 23;
        // ===========================================================
        this->InsertMove(r3, r1, instr);
        this->InsertShift(Js::OpCode::Shl_A, false, r3, r3, IR::IntConstOpnd::New(23, TyInt8, m_func), instr);
        this->InsertXor(r1, r1, r3, instr);

        // ===========================================================
        // s1 ^= s1 >> 17;
        // ===========================================================
        this->InsertMove(r3, r1, instr);
        this->InsertShift(Js::OpCode::ShrU_A, false, r3, r3, IR::IntConstOpnd::New(17, TyInt8, m_func), instr);
        this->InsertXor(r1, r1, r3, instr);

        // ===========================================================
        // s1 ^= s0;
        // ===========================================================
        this->InsertXor(r1, r1, r0, instr);

        // ===========================================================
        // s1 ^= s0 >> 26;
        // ===========================================================
        this->InsertMove(r3, r0, instr);
        this->InsertShift(Js::OpCode::ShrU_A, false, r3, r3, IR::IntConstOpnd::New(26, TyInt8, m_func), instr);
        this->InsertXor(r1, r1, r3, instr);

        // ===========================================================
        // scriptContext->GetLibrary()->SetRandSeed0(s0);
        // scriptContext->GetLibrary()->SetRandSeed1(s1);
        // ===========================================================
        this->InsertMove(
            IR::MemRefOpnd::New((BYTE*)m_func->GetScriptContextInfo()->GetLibraryAddr() + Js::JavascriptLibrary::GetRandSeed0Offset(), TyUint64, m_func), r0, instr);
        this->InsertMove(
            IR::MemRefOpnd::New((BYTE*)m_func->GetScriptContextInfo()->GetLibraryAddr() + Js::JavascriptLibrary::GetRandSeed1Offset(), TyUint64, m_func), r1, instr);

        // ===========================================================
        // dst = bit_cast<float64>(((s0 + s1) & mMant) | mExp);
        // ===========================================================
        this->InsertAdd(false, r1, r1, r0, instr);
        this->InsertMove(r3, IR::IntConstOpnd::New(mMant, TyInt64, m_func, true), instr);
        this->InsertAnd(r1, r1, r3, instr);
        this->InsertMove(r3, IR::IntConstOpnd::New(mExp, TyInt64, m_func, true), instr);
        this->InsertOr(r1, r1, r3, instr);
        this->InsertMoveBitCast(dst, r1, instr);

        // ===================================================================
        // dst -= 1.0;
        // ===================================================================
        this->InsertMove(r4, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetDoubleOnePointZeroAddr(), TyFloat64, m_func, IR::AddrOpndKindDynamicDoubleRef), instr);
        this->InsertSub(false, dst, dst, r4, instr);
    }
    else
#endif
    {
        IR::Opnd* tmpdst = dst;
        if (!dst->IsRegOpnd())
        {
            tmpdst = IR::RegOpnd::New(dst->GetType(), instr->m_func);
        }

        LoadScriptContext(instr);
        IR::Instr * helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, tmpdst, instr->m_func);
        instr->InsertBefore(helperCallInstr);
        m_lowererMD.ChangeToHelperCall(helperCallInstr, IR::JnHelperMethod::HelperDirectMath_Random);

        if (tmpdst != dst)
        {
            InsertMove(dst, tmpdst, instr);
        }
    }

    instr->Remove();
    return retInstr;
}